

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::SimpleProgramCase::linkProgram(SimpleProgramCase *this)

{
  GLuint program_00;
  deBool dVar1;
  GLenum err;
  TestError *this_00;
  GLuint program;
  SimpleProgramCase *this_local;
  
  program_00 = glu::CallLogWrapper::glCreateProgram(&(this->super_ApiCase).super_CallLogWrapper);
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || (program_00 == 0)) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      glu::CallLogWrapper::glAttachShader
                (&(this->super_ApiCase).super_CallLogWrapper,program_00,this->m_vertShader);
      glu::CallLogWrapper::glAttachShader
                (&(this->super_ApiCase).super_CallLogWrapper,program_00,this->m_fragShader);
      err = glu::CallLogWrapper::glGetError(&(this->super_ApiCase).super_CallLogWrapper);
      glu::checkError(err,(char *)0x0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                      ,0x1e8);
      glu::CallLogWrapper::glLinkProgram(&(this->super_ApiCase).super_CallLogWrapper,program_00);
      this->m_program = program_00;
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"program != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
             ,0x1e4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void linkProgram (void)
	{
		const GLuint program = glCreateProgram();

		TCU_CHECK(program != 0);

		glAttachShader(program, m_vertShader);
		glAttachShader(program, m_fragShader);
		GLU_CHECK();

		glLinkProgram(program);

		m_program = program;
	}